

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

int32_t BinaryenConstGetValueI32(BinaryenExpressionRef expr)

{
  bool bVar1;
  int32_t iVar2;
  Expression *expression;
  BinaryenExpressionRef expr_local;
  
  bVar1 = wasm::Expression::is<wasm::Const>(expr);
  if (!bVar1) {
    __assert_fail("expression->is<Const>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                  ,0xab7,"int32_t BinaryenConstGetValueI32(BinaryenExpressionRef)");
  }
  iVar2 = wasm::Literal::geti32((Literal *)(expr + 1));
  return iVar2;
}

Assistant:

int32_t BinaryenConstGetValueI32(BinaryenExpressionRef expr) {
  auto* expression = (Expression*)expr;
  assert(expression->is<Const>());
  return static_cast<Const*>(expression)->value.geti32();
}